

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

int __thiscall
ON_Xform::DecomposeSimilarity
          (ON_Xform *this,ON_3dVector *T,double *dilation,ON_Xform *R,double tolerance)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  int i_00;
  ON_Xform *pOVar5;
  ON_Xform *pOVar6;
  int i;
  int i_01;
  byte bVar7;
  double dVar8;
  double dVar9;
  ON_3dVector Ttrash;
  ON_Interval Spectrum;
  double d;
  double I [4] [4];
  ON_Xform L;
  double local_208;
  double local_1e8;
  ON_3dVector local_1e0;
  ON_Interval local_1c8;
  ON_Xform local_1b8;
  ON_Xform local_138;
  ON_Xform local_b0;
  
  bVar7 = 0;
  bVar1 = IsAffine(this);
  if (!bVar1) {
    return 0;
  }
  ON_Xform(&local_b0);
  DecomposeAffine(this,T,&local_b0);
  local_1c8 = ApproxSpectrumLTL(&local_b0);
  dVar8 = ON_Interval::Length(&local_1c8);
  if (2.220446049250313e-14 <= dVar8 * 0.5) {
    if ((tolerance <= 1.0) && (tolerance * 10.0 <= dVar8 * 0.5)) {
      return 0;
    }
    ON_Xform(&local_138);
    bVar1 = DecomposeAffine(&local_b0,&local_1e0,R,&local_138,(ON_3dVector *)&local_1b8);
    if (bVar1) {
      local_208 = 1.79769313486232e+308;
      local_1e8 = 2.2250738585072014e-308;
      i_01 = 0;
      i_00 = 0;
      iVar2 = 0;
      do {
        pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,i_01);
        if (*pdVar3 <= local_208 && local_208 != *pdVar3) {
          pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,i_01);
          local_208 = *pdVar3;
          iVar2 = i_01;
        }
        pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,i_01);
        if (local_1e8 < *pdVar3) {
          pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,i_01);
          local_1e8 = *pdVar3;
          i_00 = i_01;
        }
        i_01 = i_01 + 1;
      } while (i_01 != 3);
      pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,i_00);
      dVar8 = *pdVar3;
      pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,iVar2);
      if ((dVar8 - *pdVar3) * 0.5 <= tolerance) {
        pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,iVar2);
        dVar8 = *pdVar3;
        pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&local_1b8,i_00);
        dVar8 = (dVar8 + *pdVar3) * 0.5;
        *dilation = dVar8;
        goto LAB_0067966f;
      }
    }
    iVar2 = 0;
  }
  else {
    local_1b8.m_xform[0][0] = 0.0;
    Inv((double *)&local_b0,(double (*) [4])&local_138,(double *)&local_1b8,&local_1e0.x);
    dVar8 = (double)(~-(ulong)(local_1b8.m_xform[0][0] != 0.0) & (ulong)local_1b8.m_xform[0][0] |
                    (ulong)(1.0 / local_1b8.m_xform[0][0]) &
                    -(ulong)(local_1b8.m_xform[0][0] != 0.0));
    dVar9 = pow(ABS(dVar8),0.3333333333333333);
    dVar9 = (double)(-(ulong)(dVar8 < 0.0) & (ulong)-dVar9 | ~-(ulong)(dVar8 < 0.0) & (ulong)dVar9);
    *dilation = dVar9;
    ON_Xform(&local_1b8,1.0 / dVar9);
    operator*(&local_138,&local_1b8,&local_b0);
    pOVar5 = &local_138;
    pOVar6 = R;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    Orthogonalize(R,2.220446049250313e-15);
LAB_0067966f:
    iVar2 = (uint)(0.0 < dVar8) * 2 + -1;
  }
  return iVar2;
}

Assistant:

int ON_Xform::DecomposeSimilarity(ON_3dVector& T, double& dilation, ON_Xform& R, double tolerance) const
{
	int rval = 0;
	if (IsAffine())
	{
		ON_Xform L;
		DecomposeAffine(T, L);

		/* Three cases:
		I. L is within OrthogonalTol of being orthogonal then just return R = Linear
		(this is an optimization to avoid doing an eigen solve)
		II. Linear<10*tolerance or tol>1.0 then find the closest orthogonal matrix R.
		test the final solution to see if |*this-R|<tolerance .
		III. Otherwise return 0
		*/
		const double OrthogonalTol = 100 * ON_EPSILON;

		ON_Interval Spectrum = ApproxSpectrumLTL(L);

		double dist = Spectrum.Length()/2.0;
		if (dist<OrthogonalTol)
		{
			// Case I.
			double det = L.Determinant();
			dilation = pow(fabs(det), 1.0 / 3.0);
			if (det < 0)
				dilation *= -1.0;
			R = ON_Xform(1.0 / dilation)*L;
			R.Orthogonalize(10*ON_EPSILON);			// tune-it up.
			rval = (det > 0) ? 1 : -1;
		}

		else if (dist < 10 * tolerance || tolerance>1.0)
		{
			// Case II.
			ON_Xform Q;		// ortho change of coordinate matrix
			ON_3dVector lambda;
			ON_3dVector Ttrash;
			if (L.DecomposeAffine(Ttrash, R, Q, lambda))
			{
				// Find the min and max eigen-values
				int mini=0, maxi=0;
				double l0 = ON_DBL_MAX;
				double l1 = ON_DBL_MIN;
				for (int i = 0; i < 3; i++)
				{
					if (lambda[i] < l0)
					{
						mini = i; l0 = lambda[i];
					}
					if (l1< lambda[i])
					{
						maxi = i; l1 = lambda[i];
					}
				}
				double err = (lambda[maxi] - lambda[mini]) / 2.0;
				if (err > tolerance)
					rval = 0;
				else
				{
					dilation = (lambda[mini] + lambda[maxi]) / 2.0;
					rval = (dilation > 0) ? 1 : -1;
					//dilation;
				}
			}			
		}
	}
	return rval;
}